

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O0

TranslatorInfo * __thiscall
helics::TranslatorFederate::createTranslator
          (TranslatorFederate *this,GlobalBrokerId dest,InterfaceHandle handle,string_view key,
          string_view endpointType,string_view units)

{
  bool bVar1;
  GlobalBrokerId id;
  pointer pTVar2;
  InterfaceHandle in_EDX;
  BaseType in_ESI;
  unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *in_RDI;
  TranslatorInfo *retTarget;
  GlobalHandle cid;
  __single_object tran;
  GlobalFederateId *in_stack_ffffffffffffff48;
  GlobalHandle *this_00;
  GlobalHandle *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  GlobalBrokerId in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  GlobalFederateId in_stack_ffffffffffffffcc;
  GlobalHandle in_stack_ffffffffffffffd0;
  GlobalHandle *in_stack_ffffffffffffffd8;
  GlobalBrokerId local_4;
  
  uVar3 = 0;
  local_4.gid = in_ESI;
  bVar1 = GlobalBrokerId::operator==(&local_4,(GlobalBrokerId)0x0);
  if (!bVar1) {
    in_stack_ffffffffffffffc0.gid =
         *(BaseType *)
          ((long)&(in_RDI->_M_t).
                  super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                  .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl + 4);
    bVar1 = GlobalBrokerId::operator==(&local_4,in_stack_ffffffffffffffc0);
    id.gid = local_4.gid;
    if (!bVar1) goto LAB_006774d7;
  }
  id = GlobalFederateId::operator_cast_to_GlobalBrokerId(in_stack_ffffffffffffff48);
LAB_006774d7:
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffffcc,id);
  this_00 = (GlobalHandle *)&stack0xffffffffffffffd0;
  GlobalHandle::GlobalHandle(this_00,in_stack_ffffffffffffffcc,in_EDX);
  std::
  make_unique<helics::TranslatorInfo,helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (in_stack_ffffffffffffffd8,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffcc.gid,id.gid),
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(uVar3,in_stack_ffffffffffffffc0.gid));
  std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>::operator->
            ((unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
             0x677546);
  pTVar2 = std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>::
           get((unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
               this_00);
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::insert
            ((MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *)
             CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,in_RDI);
  std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>::~unique_ptr
            ((unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
             this_00);
  return pTVar2;
}

Assistant:

TranslatorInfo* TranslatorFederate::createTranslator(GlobalBrokerId dest,
                                                     InterfaceHandle handle,
                                                     std::string_view key,
                                                     std::string_view endpointType,
                                                     std::string_view units)
{
    auto tran = std::make_unique<TranslatorInfo>(
        GlobalHandle{(dest == parent_broker_id || dest == mCoreID) ? GlobalBrokerId{mFedID} : dest,
                     handle},
        key,
        endpointType,
        units);

    auto cid = tran->id;
    auto* retTarget = tran.get();
    // auto actualKey = key;

    // if (actualKey.empty()) {
    // actualKey = "sFilter_";
    // actualKey.append(std::to_string(handle.baseValue()));
    // }

    // if (filt->core_id == mFedID) {
    translators.insert(cid, std::move(tran));
    //} else {
    // actualKey.push_back('_');
    //  actualKey.append(std::to_string(cid.baseValue()));
    //    filters.insert({cid, handle}, std::move(filt));
    //}

    return retTarget;
}